

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O3

void __thiscall amrex::STLtools::prepare(STLtools *this)

{
  XDim3 *pXVar1;
  XDim3 *d;
  ostringstream *this_00;
  double dVar2;
  double dVar3;
  size_type sVar4;
  pointer pTVar5;
  pointer pTVar6;
  undefined1 auVar7 [16];
  int iVar8;
  Real *pRVar9;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar10;
  uint uVar11;
  long lVar12;
  byte bVar13;
  bool bVar14;
  byte bVar15;
  double *pdVar16;
  byte bVar17;
  undefined4 in_R10D;
  undefined3 uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined8 uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar33;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar41;
  undefined1 auVar40 [16];
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  double dVar56;
  double dVar57;
  double dVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  double dVar62;
  Real RVar63;
  double dVar64;
  double dVar65;
  undefined8 uVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  ReduceOps<amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMax,_amrex::ReduceOpMax,_amrex::ReduceOpMax>
  reduce_op;
  ReduceData<double,_double,_double,_double,_double,_double> reduce_data;
  ReduceOps<amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMax,_amrex::ReduceOpMax,_amrex::ReduceOpMax>
  local_541;
  ulong local_540;
  double local_538;
  undefined8 uStack_530;
  double local_528;
  undefined8 uStack_520;
  double local_518;
  double dStack_510;
  double local_508;
  double dStack_500;
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  double dStack_4e0;
  undefined1 local_4d8 [16];
  double local_4c8;
  double dStack_4c0;
  double local_4b8;
  double dStack_4b0;
  double local_4a8;
  undefined8 uStack_4a0;
  double local_490;
  double local_488;
  double dStack_480;
  double local_478;
  double dStack_470;
  double local_468;
  double dStack_460;
  double local_458;
  double dStack_450;
  double local_448;
  double dStack_440;
  double local_438;
  double dStack_430;
  double local_428;
  undefined8 uStack_420;
  double local_418;
  undefined8 uStack_410;
  double local_408;
  double dStack_400;
  double local_3f8;
  double dStack_3f0;
  double local_3e8;
  undefined8 uStack_3e0;
  double local_3d8;
  undefined8 uStack_3d0;
  double local_3c8;
  double dStack_3c0;
  double local_3b8;
  double dStack_3b0;
  double local_3a8;
  double dStack_3a0;
  double local_398;
  double dStack_390;
  ReduceData<double,_double,_double,_double,_double,_double> local_380;
  double local_348;
  undefined8 uStack_340;
  undefined1 local_338 [16];
  double local_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  double local_308;
  double dStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  double local_238;
  double dStack_230;
  double local_228;
  double dStack_220;
  double local_218;
  double dStack_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  Type local_1e8;
  Print local_1b0;
  
  if (*(int *)(ParallelContext::frames + 0xc) != 0) {
    PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
              (&this->m_tri_pts_h,(long)this->m_num_tri);
  }
  PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
            (&this->m_tri_pts_d,(long)this->m_num_tri);
  PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_>::resize
            (&this->m_tri_normals_d,(long)this->m_num_tri);
  sVar4 = (this->m_tri_pts_h).m_size;
  if (sVar4 != 0) {
    memcpy((this->m_tri_pts_d).m_data,(this->m_tri_pts_h).m_data,sVar4 * 0x48);
  }
  pTVar5 = (this->m_tri_pts_d).m_data;
  iVar8 = this->m_num_tri;
  if (0 < (long)iVar8) {
    pRVar9 = &((this->m_tri_normals_d).m_data)->z;
    lVar12 = 0;
    do {
      dVar50 = *(double *)((long)&(pTVar5->v2).x + lVar12);
      pdVar16 = (double *)((long)&(pTVar5->v2).y + lVar12);
      dVar28 = *pdVar16;
      dVar43 = pdVar16[1];
      dVar42 = *(double *)((long)&(pTVar5->v3).y + lVar12) - dVar28;
      pdVar16 = (double *)((long)&(pTVar5->v1).y + lVar12);
      dVar22 = dVar50 - *(double *)((long)&(pTVar5->v1).x + lVar12);
      dVar28 = dVar28 - *pdVar16;
      dVar33 = dVar43 - pdVar16[1];
      dVar43 = *(double *)((long)&(pTVar5->v3).z + lVar12) - dVar43;
      dVar50 = *(double *)((long)&(pTVar5->v3).x + lVar12) - dVar50;
      dVar34 = dVar28 * dVar43 - dVar42 * dVar33;
      dVar43 = dVar33 * dVar50 - dVar43 * dVar22;
      dVar50 = dVar22 * dVar42 - dVar50 * dVar28;
      dVar28 = 1.0 / SQRT(dVar50 * dVar50 + dVar34 * dVar34 + dVar43 * dVar43);
      ((XDim3 *)(pRVar9 + -2))->x = dVar28 * dVar34;
      pRVar9[-1] = dVar28 * dVar43;
      *pRVar9 = dVar50 * dVar28;
      lVar12 = lVar12 + 0x48;
      pRVar9 = pRVar9 + 3;
    } while ((long)iVar8 * 0x48 != lVar12);
  }
  ReduceData<double,double,double,double,double,double>::
  ReduceData<amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMax,amrex::ReduceOpMax,amrex::ReduceOpMax>
            ((ReduceData<double,double,double,double,double,double> *)&local_380,&local_541);
  iVar8 = this->m_num_tri;
  if (0 < (long)iVar8) {
    dVar50 = ((local_380.m_tuple.
               super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               .
               super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
             super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
             super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
             super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_element<3UL,_double>.
             m_value;
    dVar28 = ((local_380.m_tuple.
               super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               .
               super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
             super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
             super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
             super_gpu_tuple_element<2UL,_double>.m_value;
    auVar32 = *(undefined1 (*) [16])
               &((local_380.m_tuple.
                  super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                  .
                  super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
                super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
                super_gpu_tuple_element<1UL,_double>;
    auVar25._8_8_ =
         (double)((local_380.m_tuple.
                   super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                   .
                   super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
                 super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
                 super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
                 super_gpu_tuple_impl<3UL,_double,_double,_double>.
                 super_gpu_tuple_impl<4UL,_double,_double>.super_gpu_tuple_impl<5UL,_double>.
                 super_gpu_tuple_element<5UL,_double>;
    auVar25._0_8_ =
         ((local_380.m_tuple.
           super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
           .
           super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
         super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
         super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
         super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_impl<4UL,_double,_double>
         .super_gpu_tuple_element<4UL,_double>.m_value;
    lVar12 = 0;
    do {
      auVar55 = *(undefined1 (*) [16])((long)&(pTVar5->v2).y + lVar12);
      auVar21 = *(undefined1 (*) [16])((long)&(pTVar5->v1).y + lVar12);
      auVar60 = *(undefined1 (*) [16])((long)&(pTVar5->v3).y + lVar12);
      auVar30 = maxpd(auVar55,auVar21);
      auVar30 = maxpd(auVar60,auVar30);
      auVar25 = maxpd(auVar30,auVar25);
      dVar43 = *(double *)((long)&(pTVar5->v2).x + lVar12);
      auVar59._8_8_ = dVar43;
      auVar59._0_8_ = auVar55._0_8_;
      dVar22 = *(double *)((long)&(pTVar5->v1).x + lVar12);
      auVar30._8_8_ = dVar22;
      auVar30._0_8_ = auVar21._0_8_;
      auVar30 = minpd(auVar59,auVar30);
      dVar33 = *(double *)((long)&(pTVar5->v3).x + lVar12);
      auVar31._8_8_ = dVar33;
      auVar31._0_8_ = auVar60._0_8_;
      auVar30 = minpd(auVar31,auVar30);
      auVar32 = minpd(auVar30,auVar32);
      *(undefined1 (*) [16])
       &((local_380.m_tuple.
          super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
          .
          super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
        super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
        super_gpu_tuple_element<1UL,_double> = auVar32;
      uVar19 = -(ulong)(auVar55._8_8_ < auVar21._8_8_);
      dVar43 = (double)(~-(ulong)(dVar22 < dVar43) & (ulong)dVar22 |
                       (ulong)dVar43 & -(ulong)(dVar22 < dVar43));
      dVar22 = (double)(~uVar19 & (ulong)auVar21._8_8_ | (ulong)auVar55._8_8_ & uVar19);
      uVar19 = -(ulong)(dVar43 < dVar33);
      uVar20 = -(ulong)(auVar60._8_8_ < dVar22);
      dVar43 = (double)(~uVar19 & (ulong)dVar43 | (ulong)dVar33 & uVar19);
      dVar22 = (double)(~uVar20 & (ulong)dVar22 | (ulong)auVar60._8_8_ & uVar20);
      uVar19 = -(ulong)(dVar50 < dVar43);
      uVar20 = -(ulong)(dVar22 < dVar28);
      dVar50 = (double)(~uVar19 & (ulong)dVar50 | (ulong)dVar43 & uVar19);
      dVar28 = (double)(~uVar20 & (ulong)dVar28 | (ulong)dVar22 & uVar20);
      ((local_380.m_tuple.
        super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        .
        super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
      super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
      super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
      super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_element<3UL,_double>.m_value
           = dVar50;
      ((local_380.m_tuple.
        super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        .
        super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
      super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
      super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.super_gpu_tuple_element<2UL,_double>
      .m_value = dVar28;
      ((local_380.m_tuple.
        super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        .
        super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
      super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
      super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
      super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_impl<4UL,_double,_double>.
      super_gpu_tuple_impl<5UL,_double>.super_gpu_tuple_element<5UL,_double> = (double)auVar25._8_8_
      ;
      ((local_380.m_tuple.
        super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        .
        super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
      super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
      super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
      super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_impl<4UL,_double,_double>.
      super_gpu_tuple_element<4UL,_double>.m_value = auVar25._0_8_;
      lVar12 = lVar12 + 0x48;
    } while ((long)iVar8 * 0x48 != lVar12);
  }
  ReduceOps<amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMax,amrex::ReduceOpMax,amrex::ReduceOpMax>
  ::value<amrex::ReduceData<double,double,double,double,double,double>>
            (&local_1e8,&local_541,&local_380);
  pXVar1 = &this->m_ptmin;
  auVar32._0_8_ =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_element<0UL,_double>.m_value;
  auVar32._8_4_ =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_element<1UL,_double>.m_value._0_4_;
  auVar32._12_4_ =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_element<1UL,_double>.m_value._4_4_;
  (this->m_ptmin).x = (Real)auVar32._0_8_;
  (this->m_ptmin).y = (Real)auVar32._8_8_;
  d = &this->m_ptmax;
  auVar55._0_8_ =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
       super_gpu_tuple_element<2UL,_double>.m_value;
  auVar55._8_4_ =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
       super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_element<3UL,_double>.
       m_value._0_4_;
  auVar55._12_4_ =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
       super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_element<3UL,_double>.
       m_value._4_4_;
  *(undefined1 (*) [16])&(this->m_ptmin).z = auVar55;
  (this->m_ptmax).y =
       local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
       super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_impl<4UL,_double,_double>.
       super_gpu_tuple_element<4UL,_double>.m_value;
  (this->m_ptmax).z =
       (Real)local_1e8.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
             super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
             super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
             super_gpu_tuple_impl<3UL,_double,_double,_double>.
             super_gpu_tuple_impl<4UL,_double,_double>.super_gpu_tuple_impl<5UL,_double>.
             super_gpu_tuple_element<5UL,_double>.m_value;
  iVar8 = Verbose();
  uVar10 = extraout_EDX;
  if (0 < iVar8) {
    local_1b0.os = OutStream();
    local_1b0.rank = *(int *)(DAT_00816950 + -0x30);
    this_00 = &local_1b0.ss;
    local_1b0.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    *(undefined8 *)(&local_1b0.field_0x18 + *(long *)(local_1b0._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b0.os + *(long *)(*(long *)local_1b0.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"    Min: ",9);
    operator<<<amrex::XDim3,_nullptr>((ostream *)this_00,pXVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Max: ",6);
    operator<<<amrex::XDim3,_nullptr>((ostream *)this_00,d);
    std::ios::widen((char)*(undefined8 *)(local_1b0._16_8_ + -0x18) + (char)this_00);
    std::ostream::put((char)this_00);
    std::ostream::flush();
    Print::~Print(&local_1b0);
    uVar10 = extraout_EDX_00;
  }
  pTVar6 = (this->m_tri_pts_h).m_data;
  dVar50 = (pTVar6->v1).x;
  dVar28 = (pTVar6->v2).z;
  dVar29 = (pTVar6->v3).z - dVar28;
  dVar43 = (pTVar6->v2).x;
  dVar22 = (pTVar6->v2).y;
  dVar33 = (pTVar6->v1).y;
  dVar34 = (pTVar6->v1).z;
  dVar35 = dVar22 - dVar33;
  dVar42 = (pTVar6->v3).x;
  dVar23 = (dVar50 + dVar43 + dVar42) / 3.0;
  uVar26 = 0;
  auVar21._0_8_ = (pTVar6->v3).y + (pTVar6->v2).y + dVar33;
  auVar21._8_8_ = (pTVar6->v3).z + (pTVar6->v2).z + dVar34;
  dVar28 = dVar28 - dVar34;
  dVar50 = dVar43 - dVar50;
  dVar42 = dVar42 - dVar43;
  dVar33 = (pTVar6->v3).y - dVar22;
  dVar43 = dVar35 * dVar29 - dVar33 * dVar28;
  dVar28 = dVar42 * dVar28 - dVar29 * dVar50;
  dVar33 = dVar33 * dVar50 - dVar42 * dVar35;
  dVar50 = 1.0 / SQRT(dVar33 * dVar33 + dVar43 * dVar43 + dVar28 * dVar28);
  dVar43 = dVar43 * dVar50;
  dVar28 = dVar50 * dVar28;
  dVar50 = dVar50 * dVar33;
  if (dVar43 <= 2.220446049250313e-16) {
    if (dVar43 < -2.220446049250313e-16) {
      dVar33 = pXVar1->x;
      goto LAB_00735341;
    }
    dVar33 = 1.79769313486232e+308;
  }
  else {
    dVar33 = d->x;
LAB_00735341:
    dVar33 = (dVar33 - dVar23) / dVar43;
  }
  auVar32 = divpd(auVar21,_DAT_00761550);
  dVar42 = auVar32._0_8_;
  if (dVar28 <= 2.220446049250313e-16) {
    if (dVar28 < -2.220446049250313e-16) {
      dVar29 = (this->m_ptmin).y;
      goto LAB_0073537f;
    }
    dVar29 = 1.79769313486232e+308;
  }
  else {
    dVar29 = (this->m_ptmax).y;
LAB_0073537f:
    dVar29 = (dVar29 - dVar42) / dVar28;
  }
  dVar35 = auVar32._8_8_;
  if (dVar50 <= 2.220446049250313e-16) {
    if (dVar50 < -2.220446049250313e-16) {
      dVar44 = (this->m_ptmin).z;
      goto LAB_007353bd;
    }
    dVar44 = 1.79769313486232e+308;
  }
  else {
    dVar44 = (this->m_ptmax).z;
LAB_007353bd:
    dVar44 = (dVar44 - dVar35) / dVar50;
  }
  if (dVar43 <= 2.220446049250313e-16) {
    if (dVar43 < -2.220446049250313e-16) {
      dVar56 = d->x;
      goto LAB_00735400;
    }
    dVar56 = -1.79769313486232e+308;
  }
  else {
    dVar56 = pXVar1->x;
LAB_00735400:
    dVar56 = (dVar56 - dVar23) / dVar43;
  }
  if (dVar33 <= dVar29) {
    dVar29 = dVar33;
  }
  if (dVar28 <= 2.220446049250313e-16) {
    if (dVar28 < -2.220446049250313e-16) {
      RVar63 = (this->m_ptmax).y;
      goto LAB_0073543f;
    }
    dVar33 = -1.79769313486232e+308;
  }
  else {
    RVar63 = (this->m_ptmin).y;
LAB_0073543f:
    dVar33 = (RVar63 - dVar42) / dVar28;
  }
  if (dVar29 <= dVar44) {
    dVar44 = dVar29;
  }
  if (dVar50 <= 2.220446049250313e-16) {
    if (-2.220446049250313e-16 <= dVar50) {
      dVar29 = -1.79769313486232e+308;
      goto LAB_00735496;
    }
    dVar29 = (this->m_ptmax).z;
  }
  else {
    dVar29 = (this->m_ptmin).z;
  }
  dVar29 = (dVar29 - dVar35) / dVar50;
LAB_00735496:
  if (dVar33 <= dVar56) {
    dVar33 = dVar56;
  }
  if (dVar29 <= dVar33) {
    dVar29 = dVar33;
  }
  dVar33 = -dVar29;
  dVar34 = (double)((ulong)(dVar22 - dVar34) & (~(ulong)ABS(dVar22 - dVar34) | 0x3ee4f8b588e368f1));
  dVar22 = dVar33;
  if (dVar33 <= dVar44) {
    dVar22 = dVar44;
  }
  if (dVar33 <= dVar44) {
    dVar29 = dVar29 - dVar22 * 0.009;
  }
  else {
    dVar29 = dVar44 + dVar22 * 0.009;
  }
  dVar43 = (double)(~-(ulong)(ABS(dVar43) < 1e-05) & (ulong)dVar43 |
                   ((ulong)dVar43 & 0x8000000000000000 | 0x3ee4f8b588e368f1) &
                   -(ulong)(ABS(dVar43) < 1e-05)) * dVar29 + dVar23;
  dVar28 = dVar29 * (double)(~-(ulong)(ABS(dVar28) < 1e-05) & (ulong)dVar28 |
                            ((ulong)dVar28 & 0x8000000000000000 | 0x3ee4f8b588e368f1) &
                            -(ulong)(ABS(dVar28) < 1e-05)) + dVar42;
  dVar50 = dVar29 * (double)(~-(ulong)(ABS(dVar50) < 1e-05) & (ulong)dVar50 |
                            ((ulong)dVar50 & 0x8000000000000000 | 0x3ee4f8b588e368f1) &
                            -(ulong)(ABS(dVar50) < 1e-05)) + dVar35;
  (this->m_ptref).x = dVar43;
  (this->m_ptref).y = dVar28;
  (this->m_ptref).z = dVar50;
  if ((long)this->m_num_tri < 1) {
    bVar14 = true;
  }
  else {
    auVar38._8_8_ = -(ulong)(dVar50 < dVar35);
    auVar38._0_8_ = -(ulong)(dVar28 < dVar42);
    uVar11 = movmskpd(uVar10,auVar38);
    auVar60 = auVar32;
    if ((uVar11 & 1) == 0) {
      auVar60._8_8_ = dVar50;
      auVar60._0_8_ = dVar28;
    }
    local_490 = dVar35;
    if ((uVar11 & 2) == 0) {
      local_490 = dVar50;
    }
    dVar22 = dVar23;
    if (dVar23 <= dVar43) {
      dVar22 = dVar43;
    }
    uVar66 = 0;
    local_538 = dVar23;
    if (dVar43 <= dVar23) {
      local_538 = dVar43;
    }
    local_1f8 = dVar42;
    if (dVar28 <= dVar42) {
      local_1f8 = dVar28;
    }
    local_208 = dVar35;
    if (dVar50 <= dVar35) {
      local_208 = dVar50;
    }
    local_2f8 = -dVar28;
    dStack_2f0 = -dVar50;
    local_2b8 = dVar43 * dVar42 - dVar23 * dVar28;
    local_308 = -dVar50;
    dStack_300 = -dVar50;
    local_2c8 = dVar43 * dVar35 - dVar23 * dVar50;
    local_2a8 = dVar43 - dVar23;
    local_298 = dVar28 * dVar35 - dVar42 * dVar50;
    local_288 = dVar50 - dVar35;
    local_278 = dVar42 - dVar28;
    dStack_260 = dVar35 - dVar50;
    local_3b8 = -dVar42;
    dStack_3b0 = -dVar35;
    lVar12 = 0;
    bVar13 = 0;
    local_338._8_4_ = auVar32._0_4_;
    local_338._0_8_ = local_3b8;
    local_338._12_4_ = (int)((ulong)local_3b8 >> 0x20);
    auVar61._0_8_ = auVar60._0_8_;
    uStack_530 = 0;
    do {
      bVar14 = dVar33 <= dVar44;
      if (lVar12 != 0) {
        dVar29 = *(double *)((long)&(pTVar5->v1).x + lVar12);
        dVar56 = *(double *)((long)&(pTVar5->v2).x + lVar12);
        dVar69 = *(double *)((long)&(pTVar5->v3).x + lVar12);
        dVar58 = dVar56;
        if (dVar29 <= dVar56) {
          dVar58 = dVar29;
        }
        dVar47 = dVar69;
        if (dVar58 <= dVar69) {
          dVar47 = dVar58;
        }
        if (dVar47 <= dVar22) {
          dVar58 = dVar56;
          pTVar6 = (pointer)&pTVar5->v2;
          if (dVar56 <= dVar29) {
            dVar58 = dVar29;
            pTVar6 = pTVar5;
          }
          if (dVar58 < dVar69) {
            pTVar6 = (pointer)&pTVar5->v3;
          }
          pdVar16 = (double *)((long)&(pTVar6->v1).x + lVar12);
          if (local_538 < *pdVar16 || local_538 == *pdVar16) {
            dVar58 = *(double *)((long)&(pTVar5->v1).y + lVar12);
            dVar47 = *(double *)((long)&(pTVar5->v2).y + lVar12);
            dVar62 = *(double *)((long)&(pTVar5->v3).y + lVar12);
            dVar2 = dVar47;
            if (dVar58 <= dVar47) {
              dVar2 = dVar58;
            }
            dVar53 = dVar62;
            if (dVar2 <= dVar62) {
              dVar53 = dVar2;
            }
            if (dVar53 <= auVar60._0_8_) {
              dVar2 = dVar47;
              pXVar1 = &pTVar5->v2;
              if (dVar47 <= dVar58) {
                dVar2 = dVar58;
                pXVar1 = &pTVar5->v1;
              }
              if (dVar2 < dVar62) {
                pXVar1 = &pTVar5->v3;
              }
              pdVar16 = (double *)((long)&pXVar1->y + lVar12);
              if (local_1f8 < *pdVar16 || local_1f8 == *pdVar16) {
                dVar2 = *(double *)((long)&(pTVar5->v1).z + lVar12);
                dVar53 = *(double *)((long)&(pTVar5->v2).z + lVar12);
                dVar3 = *(double *)((long)&(pTVar5->v3).z + lVar12);
                dVar67 = dVar53;
                if (dVar2 <= dVar53) {
                  dVar67 = dVar2;
                }
                dVar70 = dVar3;
                if (dVar67 <= dVar3) {
                  dVar70 = dVar67;
                }
                if (dVar70 <= local_490) {
                  dVar67 = dVar53;
                  pXVar1 = &pTVar5->v2;
                  if (dVar53 <= dVar2) {
                    dVar67 = dVar2;
                    pXVar1 = &pTVar5->v1;
                  }
                  if (dVar67 < dVar3) {
                    pXVar1 = &pTVar5->v3;
                  }
                  pdVar16 = (double *)((long)&pXVar1->z + lVar12);
                  if (local_208 < *pdVar16 || local_208 == *pdVar16) {
                    local_518 = dVar29 - dVar56;
                    dStack_510 = dVar56 - dVar69;
                    uStack_420 = 0;
                    local_508 = dVar2 - dVar53;
                    dStack_500 = dVar53 - dVar3;
                    local_438 = dVar47 - dVar58;
                    local_4b8 = dVar58 - dVar62;
                    local_4a8 = dVar62 - dVar47;
                    uStack_4a0 = 0;
                    local_458 = dVar69 * dVar58 - dVar29 * dVar62;
                    dStack_450 = 0.0;
                    dStack_4f0 = 0.0;
                    local_468 = dVar69 * dVar2 - dVar29 * dVar3;
                    dStack_460 = 0.0;
                    local_348 = dVar62 * dVar2 - dVar58 * dVar3;
                    local_3f8 = dVar29 * dVar47 - dVar56 * dVar58;
                    dStack_3f0 = dVar56 * dVar62 - dVar69 * dVar47;
                    local_408 = dVar29 * dVar53 - dVar56 * dVar2;
                    dStack_400 = dVar56 * dVar3 - dVar69 * dVar53;
                    local_488 = dVar53 * dVar58 - dVar47 * dVar2;
                    dStack_480 = dVar3 * dVar47 - dVar62 * dVar53;
                    dVar70 = local_278 * local_408 +
                             local_288 * local_3f8 +
                             local_298 * local_518 +
                             local_2a8 * local_488 + local_2b8 * local_508 + local_2c8 * local_438;
                    dVar71 = local_278 * dStack_400 +
                             local_288 * dStack_3f0 +
                             local_298 * dStack_510 +
                             local_2a8 * dStack_480 + local_2b8 * dStack_500 + local_2c8 * local_4a8
                    ;
                    local_3d8 = dVar3 - dVar2;
                    uStack_340 = 0;
                    local_3e8 = dVar69 - dVar29;
                    uStack_3e0 = 0;
                    dVar67 = local_278 * local_468 +
                             local_288 * local_458 +
                             local_298 * local_3e8 +
                             local_2a8 * local_348 + local_2b8 * local_3d8 + local_2c8 * local_4b8;
                    auVar39._8_8_ = -(ulong)(ABS(dVar71) < 2.220446049250313e-16);
                    auVar39._0_8_ = -(ulong)(ABS(dVar70) < 2.220446049250313e-16);
                    uVar11 = movmskpd((int)pdVar16,auVar39);
                    bVar15 = (byte)uVar11;
                    local_4c8 = ABS(dVar67);
                    dStack_4c0 = ABS(dStack_260);
                    bVar17 = local_4c8 < 2.220446049250313e-16 & bVar15 >> 1;
                    uStack_3d0 = 0;
                    local_528 = dVar23;
                    uStack_520 = uVar26;
                    local_4f8 = dVar2;
                    local_4d8 = auVar32;
                    local_428 = dVar53;
                    local_418 = dVar22;
                    uStack_410 = uVar66;
                    local_3c8 = dVar58;
                    dStack_3c0 = dVar62;
                    if (((uVar11 & 1) != 0) && (bVar17 != 0)) {
                      local_518 = dVar56 - dVar29;
                      dStack_510 = dVar29 - dVar69;
                      local_508 = dVar53 - dVar2;
                      dStack_500 = dVar2 - dVar3;
                      local_468 = -local_438;
                      dStack_460 = -local_4b8;
                      local_458 = dVar43 - dVar29;
                      dStack_450 = dVar43 - dVar56;
                      dVar68 = dVar69 - dVar56;
                      dVar67 = dVar3 - dVar53;
                      dStack_430 = -0.0;
                      local_448 = -dVar67;
                      local_488 = -local_4a8;
                      dStack_480 = -0.0;
                      dVar64 = local_518 * (dVar28 - dVar58) + local_468 * local_458;
                      dVar65 = dVar68 * (dVar28 - dVar47) + local_488 * dStack_450;
                      local_478 = -local_508;
                      dVar70 = local_438 * (dVar50 - dVar2) + local_478 * (dVar28 - dVar58);
                      dVar71 = local_4a8 * (dVar50 - dVar53) + local_448 * (dVar28 - dVar47);
                      dVar57 = -dVar68;
                      dVar36 = -local_518;
                      dStack_4b0 = -dStack_510;
                      dVar45 = local_508 * local_458 + dVar36 * (dVar50 - dVar2);
                      dVar51 = dVar67 * dStack_450 + dVar57 * (dVar50 - dVar53);
                      auVar54._0_8_ = (dVar62 - dVar58) * local_508;
                      auVar54._8_8_ = (dVar28 - dVar62) * dStack_500;
                      dVar46 = local_438 * local_3d8 - auVar54._0_8_;
                      dVar52 = local_4b8 * (dVar50 - dVar3) - auVar54._8_8_;
                      dVar24 = local_508 * local_3e8 - local_3d8 * local_518;
                      dVar27 = dStack_500 * (dVar43 - dVar69) - (dVar50 - dVar3) * dStack_510;
                      dVar37 = local_518 * (dVar62 - dVar58) - local_3e8 * local_438;
                      dVar41 = dStack_510 * (dVar28 - dVar62) - (dVar43 - dVar69) * local_4b8;
                      auVar7._8_8_ = dVar65 * dVar65 + dVar71 * dVar71 + dVar51 * dVar51;
                      auVar7._0_8_ = dVar64 * dVar64 + dVar70 * dVar70 + dVar45 * dVar45;
                      auVar55 = sqrtpd(auVar54,auVar7);
                      auVar40._0_8_ = dVar37 * dVar37 + dVar46 * dVar46 + dVar24 * dVar24;
                      auVar40._8_8_ = dVar41 * dVar41 + dVar52 * dVar52 + dVar27 * dVar27;
                      auVar25 = sqrtpd(auVar40,auVar40);
                      dVar70 = auVar25._0_8_ * 0.5;
                      if ((2.220446049250313e-16 <
                           ABS((auVar25._8_8_ * 0.5 + auVar55._8_8_ * 0.5 + auVar55._0_8_ * 0.5) -
                               dVar70)) ||
                         (dVar24 = dVar68 * (dVar42 - dVar47) + local_488 * (dVar23 - dVar56),
                         dVar71 = local_4a8 * (dVar35 - dVar53) + (dVar42 - dVar47) * local_448,
                         dVar67 = dVar67 * (dVar23 - dVar56) + (dVar35 - dVar53) * dVar57,
                         dVar47 = local_518 * (dVar42 - dVar58) + local_468 * (dVar23 - dVar29),
                         dVar53 = dStack_510 * (dVar42 - dVar62) + dStack_460 * (dVar23 - dVar69),
                         dVar58 = local_438 * (dVar35 - dVar2) + (dVar42 - dVar58) * local_478,
                         dVar62 = local_4b8 * (dVar35 - dVar3) + (dVar42 - dVar62) * -dStack_500,
                         dVar29 = local_508 * (dVar23 - dVar29) + (dVar35 - dVar2) * dVar36,
                         dVar56 = dStack_500 * (dVar23 - dVar69) + (dVar35 - dVar3) * dStack_4b0,
                         auVar48._0_8_ = dVar47 * dVar47 + dVar58 * dVar58 + dVar29 * dVar29,
                         auVar48._8_8_ = dVar53 * dVar53 + dVar62 * dVar62 + dVar56 * dVar56,
                         auVar25 = sqrtpd(auVar48,auVar48),
                         2.220446049250313e-16 <
                         ABS((auVar25._8_8_ * 0.5 +
                             SQRT(dVar24 * dVar24 + dVar71 * dVar71 + dVar67 * dVar67) * 0.5 +
                             auVar25._0_8_ * 0.5) - dVar70))) {
                        bVar14 = true;
                      }
                      else {
                        bVar14 = false;
                      }
                      auVar60._8_8_ = 0;
                      auVar60._0_8_ = auVar61._0_8_;
                      dStack_4f0 = dVar3;
                      local_4e8 = dVar43;
                      dStack_4e0 = dVar34;
                      local_4c8 = local_438;
                      dStack_4c0 = local_4b8;
                      local_4b8 = dVar36;
                      dStack_470 = -dStack_500;
                      dStack_440 = -0.0;
                      local_438 = dVar57;
                      uStack_3d0 = 0;
                      goto LAB_0073587a;
                    }
                    dVar69 = -dVar2;
                    local_4e8 = dVar58;
                    dStack_4e0 = dVar47;
                    dStack_4b0 = local_4b8;
                    local_478 = dVar2;
                    dStack_470 = dVar53;
                    local_448 = dVar29;
                    dStack_440 = dVar56;
                    dStack_430 = local_4a8;
                    if (((0.0 <= dVar67) || (0.0 <= dVar70)) || (0.0 <= dVar71)) {
                      auVar49._8_8_ = -(ulong)(0.0 < dVar71);
                      auVar49._0_8_ = -(ulong)(0.0 < dVar70);
                      iVar8 = movmskpd(in_R10D,auVar49);
                      uVar18 = (undefined3)((uint)iVar8 >> 8);
                      in_R10D = CONCAT31(uVar18,iVar8 == 3);
                      if ((((0.0 < dVar67) && (iVar8 == 3)) ||
                          ((bVar14 = 0.0 < dVar71 * dVar67, in_R10D = CONCAT31(uVar18,bVar14),
                           (bVar15 & bVar14) != 0 ||
                           (bVar14 = 0.0 < dVar67 * dVar70, in_R10D = CONCAT31(uVar18,bVar14),
                           (bVar15 >> 1 & bVar14) != 0)))) ||
                         ((local_4c8 < 2.220446049250313e-16 && (0.0 < dVar71 * dVar70))))
                      goto LAB_00736135;
                      if ((uVar11 & 1) == 0) {
                        if (bVar17 == 0) {
LAB_00736543:
                          bVar14 = false;
                          goto LAB_00736545;
                        }
                      }
                      else if (bVar15 >> 1 == 0) {
                        if ((2.220446049250313e-16 <= local_4c8) ||
                           ((local_4b8 * (dVar23 * dVar53 + dVar56 * dStack_3b0) +
                            local_3d8 * (dVar23 * dVar47 + (double)local_338._8_8_ * dVar56) +
                            local_348 * (dVar23 - dVar56) +
                            local_3e8 * (dVar42 * dVar53 + dStack_3b0 * dVar47) +
                            local_458 * (dVar35 - dVar53) + local_468 * (dVar47 - dVar42)) *
                            (local_4b8 * (dVar56 * dVar50 + dVar43 * -dVar53) +
                            local_3d8 * (dVar56 * dVar28 + -dVar47 * dVar43) +
                            local_348 * (dVar56 - dVar43) +
                            local_3e8 * (dVar47 * dVar50 + -dVar53 * dVar28) +
                            local_458 * (dVar53 - dVar50) + local_468 * (dVar28 - dVar47)) <= 0.0))
                        goto LAB_00736543;
                        bVar14 = true;
LAB_00736545:
                        auVar60._8_8_ = 0;
                        auVar60._0_8_ = auVar61._0_8_;
                        goto LAB_0073587a;
                      }
                      dVar29 = (local_4a8 * (dVar23 * dVar2 + dVar29 * dStack_3b0) +
                               dStack_500 * (dVar23 * dVar58 + local_3b8 * dVar29) +
                               dStack_480 * (dVar23 - dVar29) +
                               dStack_510 * (dVar42 * dVar2 + dStack_3b0 * dVar58) +
                               dStack_3f0 * (dVar35 - dVar2) + dStack_400 * (dVar58 - dVar42)) *
                               (local_4a8 * (dVar29 * dVar50 + dVar43 * dVar69) +
                               dStack_500 * (dVar29 * dVar28 + -dVar58 * dVar43) +
                               dStack_480 * (dVar29 - dVar43) +
                               dStack_510 * (dVar58 * dVar50 + dVar69 * dVar28) +
                               dStack_3f0 * (dVar2 - dVar50) + dStack_400 * (dVar28 - dVar58));
                    }
                    else {
LAB_00736135:
                      dVar29 = (local_4a8 * (dVar43 * dVar2 + dVar29 * local_308) +
                               dStack_500 * (dVar43 * dVar58 + local_2f8 * dVar29) +
                               dStack_480 * (dVar43 - dVar29) +
                               dStack_510 * (dVar28 * dVar2 + local_308 * dVar58) +
                               dStack_3f0 * (dVar50 - dVar2) + dStack_400 * (dVar58 - dVar28)) *
                               (local_4a8 * (dVar29 * dVar35 + dVar23 * dVar69) +
                               dStack_500 * (dVar29 * dVar42 + -dVar58 * dVar23) +
                               dStack_480 * (dVar29 - dVar23) +
                               dStack_510 * (dVar58 * dVar35 + dVar69 * dVar42) +
                               dStack_3f0 * (dVar2 - dVar35) + dStack_400 * (dVar42 - dVar58));
                    }
                    bVar14 = 0.0 < dVar29;
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = auVar61._0_8_;
                    goto LAB_0073587a;
                  }
                }
                bVar14 = false;
                auVar61._8_8_ = 0;
                auVar60 = auVar61;
                goto LAB_0073587a;
              }
            }
          }
        }
        bVar14 = false;
      }
LAB_0073587a:
      bVar13 = bVar13 + bVar14;
      lVar12 = lVar12 + 0x48;
    } while ((long)this->m_num_tri * 0x48 != lVar12);
    bVar14 = (bool)(~bVar13 & 1);
    local_540 = auVar61._0_8_;
    local_3a8 = dVar28;
    dStack_3a0 = dVar28;
    local_398 = dVar35;
    dStack_390 = dVar35;
    local_328 = dVar23;
    dStack_320 = dVar23;
    local_318 = dVar42;
    dStack_310 = dVar42;
    local_2e8 = dVar43;
    dStack_2e0 = dVar43;
    local_2d8 = dVar50;
    dStack_2d0 = dVar50;
    dStack_2c0 = local_2c8;
    dStack_2b0 = local_2b8;
    dStack_2a0 = local_2a8;
    dStack_290 = local_298;
    dStack_280 = local_288;
    dStack_270 = local_278;
    local_268 = local_278;
    local_258 = local_288;
    dStack_250 = dVar50;
    local_248 = local_298;
    dStack_240 = dVar50;
    local_238 = local_2a8;
    dStack_230 = dVar34;
    local_228 = local_2c8;
    dStack_220 = dVar34;
    local_218 = local_2b8;
    dStack_210 = dVar34;
    dStack_200 = dVar35;
    dStack_1f0 = dVar35;
  }
  this->m_boundry_is_outside = bVar14;
  if (local_380.m_fn_value.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_380.m_fn_value.super__Function_base._M_manager)
              ((_Any_data *)&local_380.m_fn_value,(_Any_data *)&local_380.m_fn_value,
               __destroy_functor);
  }
  if (local_380.m_tuple.
      super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
      .
      super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_380.m_tuple.
                    super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                    .
                    super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_380.m_tuple.
                          super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                          .
                          super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_380.m_tuple.
                          super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                          .
                          super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
STLtools::prepare ()
{
    ParallelDescriptor::Bcast(&m_num_tri, 1);
    if (!ParallelDescriptor::IOProcessor()) {
        m_tri_pts_h.resize(m_num_tri);
    }

    //device vectors
    m_tri_pts_d.resize(m_num_tri);
    m_tri_normals_d.resize(m_num_tri);

    Gpu::copyAsync(Gpu::hostToDevice, m_tri_pts_h.begin(), m_tri_pts_h.end(),
                   m_tri_pts_d.begin());

    Triangle const* tri_pts = m_tri_pts_d.data();
    XDim3* tri_norm = m_tri_normals_d.data();

    // Compute normals in case the STL file does not have valid data for normals
    ParallelFor(m_num_tri, [=] AMREX_GPU_DEVICE (int i) noexcept
    {
        Triangle const& tri = tri_pts[i];
        XDim3 vec1{tri.v2.x-tri.v1.x, tri.v2.y-tri.v1.y, tri.v2.z-tri.v1.z};
        XDim3 vec2{tri.v3.x-tri.v2.x, tri.v3.y-tri.v2.y, tri.v3.z-tri.v2.z};
        XDim3 norm{vec1.y*vec2.z-vec1.z*vec2.y,
                   vec1.z*vec2.x-vec1.x*vec2.z,
                   vec1.x*vec2.y-vec1.y*vec2.x};
        Real tmp = 1._rt / std::sqrt(norm.x*norm.x + norm.y*norm.y + norm.z*norm.z);
        tri_norm[i].x = norm.x * tmp;
        tri_norm[i].y = norm.y * tmp;
        tri_norm[i].z = norm.z * tmp;
    });

    ReduceOps<ReduceOpMin,ReduceOpMin,ReduceOpMin,ReduceOpMax,ReduceOpMax,ReduceOpMax> reduce_op;
    ReduceData<Real,Real,Real,Real,Real,Real> reduce_data(reduce_op);
    using ReduceTuple = typename decltype(reduce_data)::Type;
    reduce_op.eval(m_num_tri, reduce_data,
                   [=] AMREX_GPU_DEVICE (int i) -> ReduceTuple
                   {
                       return {amrex::min(tri_pts[i].v1.x,
                                          tri_pts[i].v2.x,
                                          tri_pts[i].v3.x),
                               amrex::min(tri_pts[i].v1.y,
                                          tri_pts[i].v2.y,
                                          tri_pts[i].v3.y),
                               amrex::min(tri_pts[i].v1.z,
                                          tri_pts[i].v2.z,
                                          tri_pts[i].v3.z),
                               amrex::max(tri_pts[i].v1.x,
                                          tri_pts[i].v2.x,
                                          tri_pts[i].v3.x),
                               amrex::max(tri_pts[i].v1.y,
                                          tri_pts[i].v2.y,
                                          tri_pts[i].v3.y),
                               amrex::max(tri_pts[i].v1.z,
                                          tri_pts[i].v2.z,
                                          tri_pts[i].v3.z)};
                   });
    auto const& hv = reduce_data.value(reduce_op);
    m_ptmin.x = amrex::get<0>(hv);
    m_ptmin.y = amrex::get<1>(hv);
    m_ptmin.z = amrex::get<2>(hv);
    m_ptmax.x = amrex::get<3>(hv);
    m_ptmax.y = amrex::get<4>(hv);
    m_ptmax.z = amrex::get<5>(hv);

    if (amrex::Verbose() > 0) {
        amrex::Print() << "    Min: " << m_ptmin << " Max: " << m_ptmax << std::endl;
    }

    // Choose a reference point by extending the normal vector of the first
    // triangle until it's slightly outside the bounding box.
    XDim3 cent0; // centroid of the first triangle
    int is_ref_positive;
    {
        Triangle const& tri = m_tri_pts_h[0];
        cent0 = XDim3{(tri.v1.x + tri.v2.x + tri.v3.x) / 3._rt,
                      (tri.v1.y + tri.v2.y + tri.v3.y) / 3._rt,
                      (tri.v1.z + tri.v2.z + tri.v3.z) / 3._rt};
        // We are computing the normal ourselves in case the stl file does
        // not have valid data on normal.
        XDim3 vec1{tri.v2.x-tri.v1.x, tri.v2.y-tri.v1.y, tri.v2.z-tri.v1.z};
        XDim3 vec2{tri.v3.x-tri.v2.x, tri.v3.y-tri.v2.y, tri.v3.z-tri.v2.z};
        XDim3 norm{vec1.y*vec2.z-vec1.z*vec2.y,
                   vec1.z*vec2.x-vec1.x*vec2.z,
                   vec1.x*vec2.y-vec1.y*vec2.x};
        Real tmp = 1._rt / std::sqrt(norm.x*norm.x + norm.y*norm.y + norm.z*norm.z);
        norm.x *= tmp;
        norm.y *= tmp;
        norm.z *= tmp;
        // Now we need to find out where the normal vector will intersect
        // with the bounding box defined by m_ptmin and m_ptmax.
        Real Lx, Ly, Lz;
        constexpr Real eps = std::numeric_limits<Real>::epsilon();
        if (norm.x > eps) {
            Lx = (m_ptmax.x-cent0.x) / norm.x;
        } else if (norm.x < -eps) {
            Lx = (m_ptmin.x-cent0.x) / norm.x;
        } else {
            Lx = std::numeric_limits<Real>::max();
        }
        if (norm.y > eps) {
            Ly = (m_ptmax.y-cent0.y) / norm.y;
        } else if (norm.y < -eps) {
            Ly = (m_ptmin.y-cent0.y) / norm.y;
        } else {
            Ly = std::numeric_limits<Real>::max();
        }
        if (norm.z > eps) {
            Lz = (m_ptmax.z-cent0.z) / norm.z;
        } else if (norm.z < -eps) {
            Lz = (m_ptmin.z-cent0.z) / norm.z;
        } else {
            Lz = std::numeric_limits<Real>::max();
        }
        Real Lp = std::min({Lx,Ly,Lz});
        if (norm.x > eps) {
            Lx = (m_ptmin.x-cent0.x) / norm.x;
        } else if (norm.x < -eps) {
            Lx = (m_ptmax.x-cent0.x) / norm.x;
        } else {
            Lx = std::numeric_limits<Real>::lowest();
        }
        if (norm.y > eps) {
            Ly = (m_ptmin.y-cent0.y) / norm.y;
        } else if (norm.y < -eps) {
            Ly = (m_ptmax.y-cent0.y) / norm.y;
        } else {
            Ly = std::numeric_limits<Real>::lowest();
        }
        if (norm.z > eps) {
            Lz = (m_ptmin.z-cent0.z) / norm.z;
        } else if (norm.z < -eps) {
            Lz = (m_ptmax.z-cent0.z) / norm.z;
        } else {
            Lz = std::numeric_limits<Real>::lowest();
        }
        if (std::abs(norm.x) < 1.e-5) {
            norm.x = std::copysign(1.e-5, norm.x);
        }
        if (std::abs(norm.y) < 1.e-5) {
            norm.y = std::copysign(1.e-5, norm.y);
        }
        if (std::abs(norm.z) < 1.e-5) {
            norm.z = std::copysign(1.e-5, norm.z);
        }
        Real Lm = std::max({Lx,Ly,Lz});
        Real Leps = std::max(Lp,-Lm) * 0.009;
        if (Lp < -Lm) {
            m_ptref.x = cent0.x + (Lp+Leps) * norm.x;
            m_ptref.y = cent0.y + (Lp+Leps) * norm.y;
            m_ptref.z = cent0.z + (Lp+Leps) * norm.z;
            is_ref_positive = true;
        } else {
            m_ptref.x = cent0.x + (Lm-Leps) * norm.x;
            m_ptref.y = cent0.y + (Lm-Leps) * norm.y;
            m_ptref.z = cent0.z + (Lm-Leps) * norm.z;
            is_ref_positive = false;
        }
    }

    // We now need to figure out if the boundary and the reference is
    // outside or inside the object.
    XDim3 ptref = m_ptref;
    int num_isects = Reduce::Sum<int>(m_num_tri, [=] AMREX_GPU_DEVICE (int i) -> int
        {
            if (i == 0) {
                return 1-is_ref_positive;
            } else {
                Real p1[] = {ptref.x, ptref.y, ptref.z};
                Real p2[] = {cent0.x, cent0.y, cent0.z};
                return static_cast<int>(line_tri_intersects(p1, p2, tri_pts[i]));
            }
        });

    m_boundry_is_outside = num_isects % 2 == 0;
}